

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::get_eq_marks
          (Omega_h *this,Mesh *mesh,Int class_dim,vector<int,_std::allocator<int>_> *class_ids)

{
  value_type vVar1;
  void *pvVar2;
  LO size_in;
  iterator __first;
  size_type sVar3;
  void *__n;
  reference pvVar4;
  int *piVar5;
  void *__buf;
  void *extraout_RDX;
  Read<signed_char> RVar6;
  Write<signed_char> local_1f0;
  undefined1 local_1e0 [8];
  type f;
  string local_188 [32];
  undefined1 local_168 [8];
  Write<signed_char> eq_marks_w;
  LO neq;
  undefined1 local_130 [8];
  Read<int> eq_class_ids;
  string local_118 [32];
  undefined1 local_f8 [8];
  Read<signed_char> eq_class_dims;
  LO nclass_ids;
  undefined1 local_d0 [8];
  Read<int> d_sorted_class_ids;
  size_t i;
  string local_b0 [32];
  undefined1 local_90 [8];
  HostWrite<int> h_sorted_class_ids;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> sorted_class_ids;
  vector<int,_std::allocator<int>_> *class_ids_local;
  Int class_dim_local;
  Mesh *mesh_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  sorted_class_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)class_ids;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_60,class_ids);
  __first = std::begin<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)local_60);
  h_sorted_class_ids.write_.shared_alloc_.direct_ptr =
       (void *)std::end<std::vector<int,std::allocator<int>>>
                         ((vector<int,_std::allocator<int>_> *)local_60);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             h_sorted_class_ids.write_.shared_alloc_.direct_ptr);
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"",(allocator *)((long)&i + 7));
  HostWrite<int>::HostWrite((HostWrite<int> *)local_90,(LO)sVar3,(string *)local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  d_sorted_class_ids.write_.shared_alloc_.direct_ptr = (void *)0x0;
  while( true ) {
    pvVar2 = d_sorted_class_ids.write_.shared_alloc_.direct_ptr;
    __n = (void *)std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_60);
    if (__n <= pvVar2) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_60,
                        (size_type)d_sorted_class_ids.write_.shared_alloc_.direct_ptr);
    vVar1 = *pvVar4;
    piVar5 = HostWrite<int>::operator[]
                       ((HostWrite<int> *)local_90,
                        (LO)d_sorted_class_ids.write_.shared_alloc_.direct_ptr);
    *piVar5 = vVar1;
    d_sorted_class_ids.write_.shared_alloc_.direct_ptr =
         (void *)((long)d_sorted_class_ids.write_.shared_alloc_.direct_ptr + 1);
  }
  HostWrite<int>::write((HostWrite<int> *)&stack0xffffffffffffff20,(int)local_90,__buf,(size_t)__n);
  Read<int>::Read((Read<int> *)local_d0,(Write<int> *)&stack0xffffffffffffff20);
  Write<int>::~Write((Write<int> *)&stack0xffffffffffffff20);
  if (((ulong)local_d0 & 1) == 0) {
    local_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*(size_t *)local_d0;
  }
  else {
    local_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)local_d0 >> 3);
  }
  eq_class_dims.write_.shared_alloc_.direct_ptr._4_4_ = (undefined4)((ulong)local_10._M_pi >> 2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_118,"class_dim",
             (allocator *)((long)&eq_class_ids.write_.shared_alloc_.direct_ptr + 7));
  Mesh::get_array<signed_char>((Mesh *)local_f8,(Int)mesh,(string *)(ulong)(uint)class_dim);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&eq_class_ids.write_.shared_alloc_.direct_ptr + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&neq,"class_id",(allocator *)((long)&eq_marks_w.shared_alloc_.direct_ptr + 7)
            );
  Mesh::get_array<int>((Mesh *)local_130,(Int)mesh,(string *)(ulong)(uint)class_dim);
  std::__cxx11::string::~string((string *)&neq);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&eq_marks_w.shared_alloc_.direct_ptr + 7));
  size_in = Mesh::nents(mesh,class_dim);
  eq_marks_w.shared_alloc_.direct_ptr._0_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"",(allocator *)&f.field_0x4f);
  Write<signed_char>::Write((Write<signed_char> *)local_168,size_in,(string *)local_188);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&f.field_0x4f);
  Write<signed_char>::Write((Write<signed_char> *)local_1e0,(Write<signed_char> *)local_168);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.eq_marks_w.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_f8);
  f.eq_class_dims.write_.shared_alloc_.direct_ptr._0_4_ = class_dim;
  Read<int>::Read((Read<int> *)&f.class_dim,(Read<int> *)local_d0);
  Read<int>::Read((Read<int> *)&f.d_sorted_class_ids.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_130);
  f.eq_class_ids.write_.shared_alloc_.direct_ptr._0_4_ =
       eq_class_dims.write_.shared_alloc_.direct_ptr._4_4_;
  parallel_for<Omega_h::get_eq_marks(Omega_h::Mesh*,int,std::vector<int,std::allocator<int>>const&)::__0>
            ((LO)eq_marks_w.shared_alloc_.direct_ptr,(type *)local_1e0,"mark_class_closures");
  Write<signed_char>::Write(&local_1f0,(Write<signed_char> *)local_168);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_1f0);
  Write<signed_char>::~Write(&local_1f0);
  get_eq_marks(Omega_h::Mesh*,int,std::vector<int,std::allocator<int>>const&)::$_0::~__0
            ((__0 *)local_1e0);
  Write<signed_char>::~Write((Write<signed_char> *)local_168);
  Read<int>::~Read((Read<int> *)local_130);
  Read<signed_char>::~Read((Read<signed_char> *)local_f8);
  Read<int>::~Read((Read<int> *)local_d0);
  HostWrite<int>::~HostWrite((HostWrite<int> *)local_90);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60);
  RVar6.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar6.write_.shared_alloc_;
}

Assistant:

Read<I8> get_eq_marks(
    Mesh* mesh, Int class_dim, std::vector<ClassId> const& class_ids) {
  auto sorted_class_ids = class_ids;
  std::sort(begin(sorted_class_ids), end(sorted_class_ids));
  HostWrite<LO> h_sorted_class_ids(LO(sorted_class_ids.size()));
  for (size_t i = 0; i < sorted_class_ids.size(); ++i) {
    h_sorted_class_ids[LO(i)] = sorted_class_ids[i];
  }
  auto d_sorted_class_ids = Read<ClassId>(h_sorted_class_ids.write());
  auto nclass_ids = d_sorted_class_ids.size();
  auto eq_class_dims = mesh->get_array<I8>(class_dim, "class_dim");
  auto eq_class_ids = mesh->get_array<LO>(class_dim, "class_id");
  auto neq = mesh->nents(class_dim);
  Write<I8> eq_marks_w(neq);
  auto f = OMEGA_H_LAMBDA(LO eq) {
    eq_marks_w[eq] = I8((eq_class_dims[eq] == I8(class_dim)) &&
                        (-1 != binary_search(d_sorted_class_ids,
                                   eq_class_ids[eq], nclass_ids)));
  };
  parallel_for(neq, f, "mark_class_closures");
  return eq_marks_w;
}